

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_splitter.cpp
# Opt level: O0

void RandomSampleCommand(uint32_t *seed,uint16_t *data,size_t length,size_t stride,
                        HistogramCommand *sample)

{
  size_t pos;
  HistogramCommand *sample_local;
  size_t stride_local;
  size_t length_local;
  uint16_t *data_local;
  uint32_t *seed_local;
  long local_18;
  ushort *local_10;
  
  pos = 0;
  stride_local = length;
  if (stride < length) {
    *seed = *seed * 0x41a7;
    pos = (ulong)*seed % ((length - stride) + 1);
    stride_local = stride;
  }
  sample->total_count_ = stride_local + sample->total_count_;
  local_18 = stride_local + 1;
  local_10 = data + pos;
  while (local_18 = local_18 + -1, local_18 != 0) {
    sample->data_[*local_10] = sample->data_[*local_10] + 1;
    local_10 = local_10 + 1;
  }
  return;
}

Assistant:

static void FN(RandomSample)(uint32_t* seed,
                             const DataType* data,
                             size_t length,
                             size_t stride,
                             HistogramType* sample) {
  size_t pos = 0;
  if (stride >= length) {
    stride = length;
  } else {
    pos = MyRand(seed) % (length - stride + 1);
  }
  FN(HistogramAddVector)(sample, data + pos, stride);
}